

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  uv_stream_t *stream;
  uv_loop_t *puVar6;
  int iVar7;
  __pid_t __pid;
  __pid_t _Var8;
  int (*pipes) [2];
  ulong uVar9;
  long *plVar10;
  ssize_t sVar11;
  int *piVar12;
  ulong uVar13;
  int (*fds) [2];
  uv_rwlock_t *rwlock;
  long lVar14;
  long lVar15;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  uv_process_t *local_48;
  uv_loop_t *local_40;
  void **local_38;
  
  signal_pipe[0] = -1;
  signal_pipe[1] = -1;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x193,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x198,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar10 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar10;
  *plVar10 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar13 = 3;
  if (3 < options->stdio_count) {
    uVar13 = (ulong)(uint)options->stdio_count;
  }
  pipes = (int (*) [2])uv__malloc(uVar13 * 8);
  if (pipes == (int (*) [2])0x0) {
    return -0xc;
  }
  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    pipes[uVar9] = (int  [2])0xffffffffffffffff;
  }
  lVar14 = 8;
  fds = pipes;
  local_48 = process;
  local_40 = loop;
  local_38 = ppvVar1;
  for (lVar15 = 0; lVar15 < options->stdio_count; lVar15 = lVar15 + 1) {
    puVar4 = options->stdio;
    uVar3 = *(uint *)((long)puVar4 + lVar14 + -8);
    switch(uVar3 & 7) {
    case 0:
      break;
    case 1:
      lVar5 = *(long *)((long)&puVar4->flags + lVar14);
      if (lVar5 == 0) {
        __assert_fail("container->data.stream != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,199,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      if (*(int *)(lVar5 + 0x10) != 7) {
LAB_004f58f1:
        iVar7 = -0x16;
        goto LAB_004f5a0b;
      }
      iVar7 = uv__make_socketpair(*fds,0);
      if (iVar7 != 0) goto LAB_004f5a0b;
      break;
    case 2:
    case 4:
      plVar10 = (long *)((long)&puVar4->flags + lVar14);
      if ((uVar3 & 2) == 0) {
        plVar10 = (long *)(*plVar10 + 0xb8);
      }
      if ((int)*plVar10 == -1) goto LAB_004f58f1;
      (*fds)[1] = (int)*plVar10;
      break;
    default:
      __assert_fail("0 && \"Unexpected flags\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                    ,0xdb,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
    }
    fds = fds + 1;
    lVar14 = lVar14 + 0x10;
  }
  iVar7 = uv__make_pipe(signal_pipe,0);
  puVar6 = local_40;
  if (iVar7 == 0) {
    uv_signal_start(&local_40->child_watcher,uv__chld,0x11);
    rwlock = &puVar6->cloexec_lock;
    uv_rwlock_wrlock(rwlock);
    __pid = fork();
    if (__pid != -1) {
      if (__pid == 0) {
        uv__process_child_init(options,(int)uVar13,pipes,signal_pipe[1]);
        goto LAB_004f5c64;
      }
      uv_rwlock_wrunlock(rwlock);
      uv__close(signal_pipe[1]);
      local_48->status = 0;
      exec_errorno = 0;
      do {
        sVar11 = read(signal_pipe[0],&exec_errorno,4);
        if (sVar11 != -1) {
          if (sVar11 == 0) goto LAB_004f5a90;
          if (sVar11 != 4) goto LAB_004f5c0f;
          goto LAB_004f5a69;
        }
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
      if (*piVar12 != 0x20) {
LAB_004f5c0f:
        abort();
      }
      do {
        _Var8 = waitpid(__pid,&status,0);
        if (_Var8 != -1) break;
      } while (*piVar12 == 4);
      if (_Var8 != __pid) {
        __assert_fail("err == pid",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                      ,0x1f1,
                      "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
      }
      goto LAB_004f5a90;
    }
    piVar12 = __errno_location();
    iVar7 = -*piVar12;
    uv_rwlock_wrunlock(rwlock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
  }
LAB_004f5a0b:
  lVar14 = 0;
  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    if (((long)options->stdio_count <= (long)uVar9) ||
       ((*(byte *)((long)&options->stdio->flags + lVar14) & 6) == 0)) {
      if (pipes[uVar9][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar9][0]);
      }
      if (pipes[uVar9][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar9][1]);
      }
    }
    lVar14 = lVar14 + 0x10;
  }
LAB_004f5b8c:
  uv__free(pipes);
  return iVar7;
  while (piVar12 = __errno_location(), *piVar12 == 4) {
LAB_004f5a69:
    _Var8 = waitpid(__pid,&status,0);
    if (_Var8 != -1) break;
  }
  if (_Var8 != __pid) {
LAB_004f5c64:
    __assert_fail("err == pid",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x1ec,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
LAB_004f5a90:
  uv__close_nocheckstdio(signal_pipe[0]);
  lVar14 = 0;
  for (lVar15 = 0; lVar15 < options->stdio_count; lVar15 = lVar15 + 1) {
    puVar4 = options->stdio;
    if (((*(byte *)((long)&puVar4->flags + lVar14) & 1) != 0) && (-1 < pipes[lVar15][0])) {
      iVar7 = uv__close(pipes[lVar15][1]);
      if (iVar7 != 0) goto LAB_004f5c0f;
      pipes[lVar15][1] = -1;
      uv__nonblock_ioctl(pipes[lVar15][0],1);
      stream = *(uv_stream_t **)((long)&puVar4->data + lVar14);
      if ((stream->type != UV_NAMED_PIPE) || (iVar7 = 0x60, *(int *)&stream[1].data == 0)) {
        iVar7 = (uint)(lVar14 == 0) * 0x20 + 0x20;
      }
      iVar7 = uv__stream_open(stream,pipes[lVar15][0],iVar7);
      if (iVar7 != 0) goto LAB_004f5bac;
    }
    lVar14 = lVar14 + 0x10;
  }
  if (exec_errorno == 0) {
    local_48->queue[0] = local_40->process_handles;
    plVar10 = (long *)local_40->process_handles[1];
    local_48->queue[1] = plVar10;
    *plVar10 = (long)local_38;
    local_40->process_handles[1] = local_38;
    uVar3 = local_48->flags;
    if (((uVar3 >> 0xe & 1) == 0) && (local_48->flags = uVar3 | 0x4000, (uVar3 >> 0xd & 1) != 0)) {
      puVar2 = &local_48->loop->active_handles;
      *puVar2 = *puVar2 + 1;
    }
  }
  local_48->pid = __pid;
  local_48->exit_cb = options->exit_cb;
  iVar7 = exec_errorno;
  goto LAB_004f5b8c;
LAB_004f5bac:
  for (; lVar14 != 0; lVar14 = lVar14 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar14) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar14 + -8));
    }
  }
  goto LAB_004f5a0b;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return -ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = uv__malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  uv__free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }
    uv__free(pipes);
  }

  return err;
#endif
}